

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_style_set_cursor(nk_context *ctx,nk_style_cursor c)

{
  nk_cursor *pnVar1;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x3a43,"int nk_style_set_cursor(struct nk_context *, enum nk_style_cursor)");
  }
  pnVar1 = (ctx->style).cursors[c];
  if (pnVar1 != (nk_cursor *)0x0) {
    (ctx->style).cursor_active = pnVar1;
    return 1;
  }
  return 0;
}

Assistant:

NK_API int
nk_style_set_cursor(struct nk_context *ctx, enum nk_style_cursor c)
{
    struct nk_style *style;
    NK_ASSERT(ctx);
    if (!ctx) return 0;
    style = &ctx->style;
    if (style->cursors[c]) {
        style->cursor_active = style->cursors[c];
        return 1;
    }
    return 0;
}